

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

void GPU_SetShapeBlendMode(GPU_BlendPresetEnum preset)

{
  GPU_Context *pGVar1;
  GPU_Target *pGVar2;
  GPU_Renderer *pGVar3;
  GPU_BlendMode local_18;
  
  if (((_gpu_current_renderer != (GPU_Renderer *)0x0) &&
      (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0)) &&
     (GPU_GetBlendModeFromPreset(&local_18,preset), pGVar3 = _gpu_current_renderer,
     _gpu_current_renderer != (GPU_Renderer *)0x0)) {
    if (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0) {
      pGVar1 = _gpu_current_renderer->current_context_target->context;
      (pGVar1->shapes_blend_mode).source_color = local_18.source_color;
      (pGVar1->shapes_blend_mode).dest_color = local_18.dest_color;
      (pGVar1->shapes_blend_mode).source_alpha = local_18.source_alpha;
      (pGVar1->shapes_blend_mode).dest_alpha = local_18.dest_alpha;
    }
    if ((pGVar3 != (GPU_Renderer *)0x0) &&
       (pGVar2 = pGVar3->current_context_target, pGVar2 != (GPU_Target *)0x0)) {
      pGVar1 = pGVar2->context;
      (pGVar1->shapes_blend_mode).color_equation = local_18.color_equation;
      (pGVar1->shapes_blend_mode).alpha_equation = local_18.alpha_equation;
    }
  }
  return;
}

Assistant:

void GPU_SetShapeBlendMode(GPU_BlendPresetEnum preset)
{
    GPU_BlendMode b;
    if(_gpu_current_renderer == NULL || _gpu_current_renderer->current_context_target == NULL)
        return;

    b = GPU_GetBlendModeFromPreset(preset);
    GPU_SetShapeBlendFunction(b.source_color, b.dest_color, b.source_alpha, b.dest_alpha);
    GPU_SetShapeBlendEquation(b.color_equation, b.alpha_equation);
}